

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner_boundary.cpp
# Opt level: O2

void __thiscall
duckdb::CSVIterator::SetCurrentBoundaryToPosition
          (CSVIterator *this,bool single_threaded,CSVReaderOptions *reader_options)

{
  idx_t iVar1;
  bool bVar2;
  ulong uVar3;
  undefined7 in_register_00000031;
  ulong uVar4;
  
  if ((int)CONCAT71(in_register_00000031,single_threaded) == 0) {
    uVar3 = (reader_options->maximum_line_size).value;
    uVar4 = (reader_options->buffer_size_option).value >> 2 & 0xfffffffffffffffc;
    if (uVar4 <= uVar3) {
      uVar4 = uVar3;
    }
    iVar1 = (this->pos).buffer_pos;
    (this->boundary).buffer_idx = (this->pos).buffer_idx;
    uVar3 = uVar4;
    if (iVar1 != 0) {
      uVar3 = (uVar4 + iVar1) - 1;
      uVar3 = uVar3 - uVar3 % uVar4;
    }
    (this->boundary).end_pos = uVar3;
    (this->boundary).buffer_pos = uVar3 - uVar4;
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
  this->is_set = bVar2;
  return;
}

Assistant:

void CSVIterator::SetCurrentBoundaryToPosition(bool single_threaded, const CSVReaderOptions &reader_options) {
	if (single_threaded) {
		is_set = false;
		return;
	}
	const auto bytes_per_thread = BytesPerThread(reader_options);

	boundary.buffer_idx = pos.buffer_idx;
	if (pos.buffer_pos == 0) {
		boundary.end_pos = bytes_per_thread;
	} else {
		boundary.end_pos = ((pos.buffer_pos + bytes_per_thread - 1) / bytes_per_thread) * bytes_per_thread;
	}

	boundary.buffer_pos = boundary.end_pos - bytes_per_thread;
	is_set = true;
}